

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O3

Status __thiscall osqp::OsqpSolver::UpdateTimeLimit(OsqpSolver *this,double time_limit_new)

{
  c_int cVar1;
  AlphaNum *in_RCX;
  undefined8 *in_RSI;
  string_view message;
  string_view message_00;
  string_view message_01;
  string local_98;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  if ((OSQPWorkspace *)*in_RSI == (OSQPWorkspace *)0x0) {
    message_00._M_str = (char *)0x1e;
    message_00._M_len = (size_t)this;
    absl::FailedPreconditionError(message_00);
  }
  else if (0.0 <= time_limit_new) {
    cVar1 = osqp_update_time_limit((OSQPWorkspace *)*in_RSI,time_limit_new);
    if (cVar1 == 0) {
      (this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
           (OSQPWorkspaceHelper *)0x1;
    }
    else {
      message_01._M_str = (char *)0x2b;
      message_01._M_len = (size_t)this;
      absl::UnknownError(message_01);
    }
  }
  else {
    local_48 = 0x1a;
    local_40 = "Invalid time_limit value: ";
    local_78.piece_._M_len =
         absl::numbers_internal::SixDigitsToBuffer(time_limit_new,local_78.digits_);
    local_78.piece_._M_str = local_78.digits_;
    absl::StrCat_abi_cxx11_(&local_98,(absl *)&local_48,&local_78,in_RCX);
    message._M_str = (char *)local_98._M_string_length;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateTimeLimit(const double time_limit_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (time_limit_new < 0.0) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid time_limit value: ", time_limit_new));
  }
  if (osqp_update_time_limit(workspace_.get(), time_limit_new) != 0) {
    return absl::UnknownError("osqp_update_time_limit unexpectedly failed.");
  }
  return absl::OkStatus();
}